

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QBGPlanner_TreeIncPruneBnB.cpp
# Opt level: O0

QFunctionsDiscrete * __thiscall
QBGPlanner_TreeIncPruneBnB::BackupStage
          (QBGPlanner_TreeIncPruneBnB *this,QFunctionsDiscrete *Qs,size_t maxNrAlphas)

{
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar1;
  int iVar2;
  size_t sVar3;
  reference ppmVar4;
  ulong uVar5;
  size_type sVar6;
  AlphaVectorPlanning *pAVar7;
  reference pvVar8;
  reference this_00;
  reference pvVar9;
  reference ppvVar10;
  ostream *this_01;
  ostream *__x;
  PlanningUnitDecPOMDPDiscrete *pPVar11;
  undefined4 extraout_var;
  ostream *this_02;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *this_03;
  MonahanPlanner *in_RSI;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *in_RDI;
  double dVar12;
  undefined1 auVar13 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var_00 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  GaoVectorSetIndex aPrime_2;
  GaoVectorSetIndex o_2;
  GaoVectorSetIndex a_3;
  AlphaVector null_vec;
  vector<AlphaVector,_std::allocator<AlphaVector>_> G;
  stringstream ss;
  vector<AlphaVector,_std::allocator<AlphaVector>_> L;
  Index a_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pol;
  Index k;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  jpol;
  AlphaVector alpha;
  size_t nr;
  Index aPrime_1;
  Index aPrime;
  AlphaVector v1;
  double g_a_o_v_s;
  double R_s_a_o;
  Index s;
  vector<double,_std::allocator<double>_> v_temp;
  Index vectorI;
  double gamma;
  GaoVectorSetIndex o_1;
  GaoVectorSetIndex a_1;
  size_t total_number_Gaoa;
  VectorSet *gao;
  uint o;
  uint a;
  GaoVectorSet Gao;
  Index nrO;
  Index nrA;
  Index nrS;
  ValueFunctionPOMDPDiscrete V;
  QFunctionsDiscrete *Q;
  Index in_stack_fffffffffffff668;
  Index in_stack_fffffffffffff66c;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffff670;
  value_type *in_stack_fffffffffffff678;
  Timing *in_stack_fffffffffffff680;
  string *in_stack_fffffffffffff688;
  Timing *in_stack_fffffffffffff690;
  pointer *in_stack_fffffffffffff698;
  pointer *in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a8;
  undefined4 in_stack_fffffffffffff6ac;
  ostream *in_stack_fffffffffffff6b0;
  ostream *in_stack_fffffffffffff6b8;
  ValueFunctionPOMDPDiscrete *in_stack_fffffffffffff6e0;
  AlphaVectorPlanning *in_stack_fffffffffffff6e8;
  undefined8 in_stack_fffffffffffff6f0;
  VectorSet *in_stack_fffffffffffff6f8;
  Timing *this_04;
  reference in_stack_fffffffffffff740;
  reference in_stack_fffffffffffff748;
  QBGPlanner_TreeIncPruneBnB *in_stack_fffffffffffff750;
  Index in_stack_fffffffffffff758;
  Index in_stack_fffffffffffff75c;
  QBGPlanner_TreeIncPruneBnB *in_stack_fffffffffffff760;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffff7b0;
  AlphaVectorPlanning *in_stack_fffffffffffff7b8;
  string local_768 [144];
  QBGPlanner_TreeIncPruneBnB *in_stack_fffffffffffff928;
  ulong local_6c8;
  ulong local_6a0;
  ulong local_698;
  string local_690 [32];
  AlphaVector local_670;
  string local_630 [32];
  string local_610 [32];
  stringstream local_5f0 [16];
  ostream local_5e0 [400];
  uint local_450;
  uint local_42c;
  Timing local_40a;
  size_type local_3a0;
  uint local_27c;
  Index local_234;
  AlphaVector local_230;
  double local_1e8;
  double local_1e0;
  uint local_1d8;
  uint local_1b4;
  double local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_138;
  uint local_130;
  uint local_12c;
  uint local_a4;
  uint local_a0;
  undefined4 local_9c;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_98;
  undefined8 local_78;
  undefined8 local_40;
  undefined1 auVar14 [16];
  
  in_RSI[1].super_AlphaVectorPlanning._m_T.
  super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RSI[1].super_AlphaVectorPlanning._m_T.
  super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RSI[1].super_AlphaVectorPlanning._m_O.
  super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_40 = 0;
  std::allocator<unsigned_long_long>::allocator((allocator<unsigned_long_long> *)0x94d34a);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffff690,(size_type)in_stack_fffffffffffff688,
             (value_type_conflict2 *)in_stack_fffffffffffff680,
             (allocator_type *)in_stack_fffffffffffff678);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator=
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffff680,
             (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffff678);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffff680);
  std::allocator<unsigned_long_long>::~allocator((allocator<unsigned_long_long> *)0x94d3af);
  local_78 = 0;
  std::allocator<unsigned_long_long>::allocator((allocator<unsigned_long_long> *)0x94d3e6);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffff690,(size_type)in_stack_fffffffffffff688,
             (value_type_conflict2 *)in_stack_fffffffffffff680,
             (allocator_type *)in_stack_fffffffffffff678);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator=
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffff680,
             (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffff678);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffff680);
  std::allocator<unsigned_long_long>::~allocator((allocator<unsigned_long_long> *)0x94d44b);
  AlphaVectorPlanning::QFunctionsToValueFunction
            ((QFunctionsDiscrete *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  sVar3 = PlanningUnitMADPDiscrete::GetNrStates
                    (&in_stack_fffffffffffff670->super_PlanningUnitMADPDiscrete);
  local_9c = (undefined4)sVar3;
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  sVar3 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x94d4c1);
  local_a0 = (uint)sVar3;
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  sVar3 = PlanningUnitMADPDiscrete::GetNrJointObservations((PlanningUnitMADPDiscrete *)0x94d4fe);
  local_a4 = (uint)sVar3;
  std::operator<<((ostream *)&std::cout,
                  "TreeIncPruneBGPlanner::BackupStage computing all Gaoa vectors");
  std::ostream::flush();
  auVar15._8_56_ = extraout_var_00;
  auVar15._0_8_ = extraout_XMM1_Qa;
  AlphaVectorPlanning::BackProject(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  for (local_12c = 0; local_12c != local_a0; local_12c = local_12c + 1) {
    for (local_130 = 0; local_130 != local_a4; local_130 = local_130 + 1) {
      boost::
      multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
      ::operator[]((multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                    *)in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
      ppmVar4 = boost::detail::multi_array::
                sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
                ::operator[]((sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
                              *)in_stack_fffffffffffff6a0,(index)in_stack_fffffffffffff698);
      pmVar1 = *ppmVar4;
      boost::detail::multi_array::
      sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
      ::~sub_array((sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
                    *)0x94d5f7);
      local_138 = pmVar1;
      AlphaVectorPlanning::VectorSetToValueFunction
                (in_stack_fffffffffffff6f8,(Index)((ulong)in_stack_fffffffffffff6f0 >> 0x20),
                 (BGPolicyIndex)in_stack_fffffffffffff6e8);
      boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::
      operator[]((multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                 in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
      boost::detail::multi_array::
      sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::operator[]
                ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                 in_stack_fffffffffffff6a0,(index)in_stack_fffffffffffff698);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator=
                ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff680,
                 (vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff678);
      boost::detail::multi_array::
      sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::~sub_array
                ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)0x94d690)
      ;
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
                ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff680);
      pmVar1 = local_138;
      if (local_138 !=
          (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *)0x0) {
        boost::numeric::ublas::
        matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::~matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)in_stack_fffffffffffff670);
        operator_delete(pmVar1,0x28);
      }
    }
  }
  local_198 = 0;
  for (local_1a0 = 0; local_1a0 != local_a0; local_1a0 = local_1a0 + 1) {
    for (local_1a8 = 0; local_1a8 != local_a4; local_1a8 = local_1a8 + 1) {
      AlphaVectorPlanning::GetPU
                ((AlphaVectorPlanning *)
                 CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      local_1b0 = PlanningUnitDecPOMDPDiscrete::GetDiscount
                            ((PlanningUnitDecPOMDPDiscrete *)0x94d867);
      local_1b4 = 0;
      while( true ) {
        uVar5 = (ulong)local_1b4;
        sVar6 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(&local_98);
        if (uVar5 == sVar6) break;
        AlphaVectorPlanning::GetPU
                  ((AlphaVectorPlanning *)
                   CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
        PlanningUnitMADPDiscrete::GetNrStates
                  (&in_stack_fffffffffffff670->super_PlanningUnitMADPDiscrete);
        std::allocator<double>::allocator((allocator<double> *)0x94d902);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff690,
                   (size_type)in_stack_fffffffffffff688,(allocator_type *)in_stack_fffffffffffff680)
        ;
        std::allocator<double>::~allocator((allocator<double> *)0x94d92e);
        local_1d8 = 0;
        while( true ) {
          pAVar7 = (AlphaVectorPlanning *)(ulong)local_1d8;
          AlphaVectorPlanning::GetPU
                    ((AlphaVectorPlanning *)
                     CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
          in_stack_fffffffffffff7b8 =
               (AlphaVectorPlanning *)
               PlanningUnitMADPDiscrete::GetNrStates
                         (&in_stack_fffffffffffff670->super_PlanningUnitMADPDiscrete);
          auVar14 = auVar15._0_16_;
          if (pAVar7 == in_stack_fffffffffffff7b8) break;
          in_stack_fffffffffffff7b0 =
               AlphaVectorPlanning::GetPU
                         ((AlphaVectorPlanning *)
                          CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
          dVar12 = PlanningUnitDecPOMDPDiscrete::GetReward
                             (in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
                              in_stack_fffffffffffff668);
          AlphaVectorPlanning::GetPU
                    ((AlphaVectorPlanning *)
                     CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
          sVar3 = PlanningUnitMADPDiscrete::GetNrJointObservations
                            ((PlanningUnitMADPDiscrete *)0x94d9f0);
          auVar14 = vcvtusi2sd_avx512f(auVar14,sVar3);
          local_1e0 = dVar12 / auVar14._0_8_;
          boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::
          operator[]((multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *
                     )in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
          boost::detail::multi_array::
          sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::operator[]
                    ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                     in_stack_fffffffffffff6a0,(index)in_stack_fffffffffffff698);
          std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at
                    ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff670,
                     CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
          auVar13._0_8_ =
               AlphaVector::GetValue
                         ((AlphaVector *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
          boost::detail::multi_array::
          sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::~sub_array
                    ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                     0x94daaf);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_1e0;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_1b0;
          auVar15 = ZEXT1664(auVar14);
          auVar13._8_8_ = 0;
          auVar14 = vfmadd213sd_fma(auVar13,auVar14,auVar16);
          local_1e8 = auVar13._0_8_;
          pvVar8 = std::vector<double,_std::allocator<double>_>::at
                             ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff670,
                              CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
          *pvVar8 = auVar14._0_8_;
          local_1d8 = local_1d8 + 1;
        }
        AlphaVectorPlanning::GetPU
                  ((AlphaVectorPlanning *)
                   CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
        in_stack_fffffffffffff760 =
             (QBGPlanner_TreeIncPruneBnB *)
             PlanningUnitMADPDiscrete::GetNrStates
                       (&in_stack_fffffffffffff670->super_PlanningUnitMADPDiscrete);
        AlphaVector::AlphaVector
                  ((AlphaVector *)in_stack_fffffffffffff690,(size_t)in_stack_fffffffffffff688);
        AlphaVector::SetValues
                  ((AlphaVector *)in_stack_fffffffffffff690,
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff688);
        AlphaVector::SetAction(&local_230,(Index)local_1a0);
        this_00 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator[]
                            (&local_98,(ulong)local_1b4);
        in_stack_fffffffffffff75c = AlphaVector::GetAction(this_00);
        local_234 = in_stack_fffffffffffff75c;
        boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>::
        operator[]((multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::operator[]
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        in_stack_fffffffffffff750 =
             (QBGPlanner_TreeIncPruneBnB *)
             boost::detail::multi_array::
             sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::operator[]
                       ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                        in_stack_fffffffffffff6a0,(index)in_stack_fffffffffffff698);
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                  ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff680,
                   in_stack_fffffffffffff678);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                   0x94dcca);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                   0x94dcd7);
        AlphaVector::~AlphaVector((AlphaVector *)0x94dce4);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff680);
        local_1b4 = local_1b4 + 1;
      }
      for (local_27c = 0; local_27c < local_a0; local_27c = local_27c + 1) {
        boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>::
        operator[]((multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::operator[]
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        in_stack_fffffffffffff748 =
             boost::detail::multi_array::
             sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::operator[]
                       ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                        in_stack_fffffffffffff6a0,(index)in_stack_fffffffffffff698);
        AlphaVectorPlanning::Prune
                  (in_stack_fffffffffffff7b8,(ValueFunctionPOMDPDiscrete *)in_stack_fffffffffffff7b0
                  );
        boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>::
        operator[]((multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::operator[]
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        in_stack_fffffffffffff740 =
             boost::detail::multi_array::
             sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::operator[]
                       ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                        in_stack_fffffffffffff6a0,(index)in_stack_fffffffffffff698);
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator=
                  ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff680,
                   (vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff678);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                   0x94deb2);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                   0x94debf);
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
                  ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff680);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                   0x94ded9);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                   0x94dee6);
        boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>::
        operator[]((multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::operator[]
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        pvVar9 = boost::detail::multi_array::
                 sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::operator[]
                           ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>
                             *)in_stack_fffffffffffff6a0,(index)in_stack_fffffffffffff698);
        boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>::
        operator[]((multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL> *
                   )in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL>::operator[]
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        ppvVar10 = boost::detail::multi_array::
                   sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL>::
                   operator[]((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL>
                               *)in_stack_fffffffffffff6a0,(index)in_stack_fffffffffffff698);
        *ppvVar10 = pvVar9;
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL> *)
                   0x94dfd0);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL> *)
                   0x94dfdd);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                   0x94dfea);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                   0x94dff7);
        boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>::
        operator[]((multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::operator[]
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        pvVar9 = boost::detail::multi_array::
                 sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::operator[]
                           ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>
                             *)in_stack_fffffffffffff6a0,(index)in_stack_fffffffffffff698);
        sVar6 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(pvVar9);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                   0x94e07e);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                   0x94e08b);
        local_198 = sVar6 + local_198;
        local_3a0 = sVar6;
      }
    }
  }
  this_01 = std::operator<<((ostream *)&std::cout," - total number of back-projected gamma vectors:"
                           );
  std::ostream::operator<<(this_01,local_198);
  __x = std::operator<<((ostream *)&std::cout,".");
  std::ostream::operator<<(__x,std::endl<char,std::char_traits<char>>);
  AlphaVector::AlphaVector
            ((AlphaVector *)in_stack_fffffffffffff690,(size_t)in_stack_fffffffffffff688);
  local_40a._m_timesMap._M_t._M_impl._1_1_ = 0;
  this_04 = &local_40a;
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x94e337);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            *)in_stack_fffffffffffff690,(size_type)in_stack_fffffffffffff688,
           (allocator_type *)in_stack_fffffffffffff680);
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::~allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x94e363);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)0x94e370);
  local_42c = 0;
  while( true ) {
    uVar5 = (ulong)local_42c;
    pPVar11 = AlphaVectorPlanning::GetPU
                        ((AlphaVectorPlanning *)
                         CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    iVar2 = (*(pPVar11->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])();
    if (uVar5 == CONCAT44(extraout_var,iVar2)) break;
    AlphaVectorPlanning::GetPU
              ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668))
    ;
    PlanningUnitMADPDiscrete::GetNrObservations
              (&in_stack_fffffffffffff670->super_PlanningUnitMADPDiscrete,in_stack_fffffffffffff66c)
    ;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x94e40d);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff690,
               (size_type)in_stack_fffffffffffff688,
               (value_type_conflict1 *)in_stack_fffffffffffff680,
               (allocator_type *)in_stack_fffffffffffff678);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x94e43a);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)in_stack_fffffffffffff680,(value_type *)in_stack_fffffffffffff678);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff680);
    local_42c = local_42c + 1;
  }
  for (local_450 = 0; local_450 != local_a0; local_450 = local_450 + 1) {
    std::operator<<((ostream *)&std::cout,"\n\n--------------------------------------\n");
    this_02 = std::operator<<((ostream *)&std::cout,"-proceeding with a=");
    in_stack_fffffffffffff6b8 = (ostream *)std::ostream::operator<<(this_02,local_450);
    std::operator<<(in_stack_fffffffffffff6b8,"-------------------\n");
    std::operator<<((ostream *)&std::cout,"--------------------------------------\n\n");
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x94e59a);
    std::__cxx11::stringstream::stringstream(local_5f0);
    in_stack_fffffffffffff6b0 = std::operator<<(local_5e0,"ComputePOMDPheur_ts");
    iVar2 = MonahanPlanner::GetTimeStep(in_RSI);
    std::ostream::operator<<(in_stack_fffffffffffff6b0,iVar2);
    in_stack_fffffffffffff6a0 =
         &in_RSI[1].super_AlphaVectorPlanning._m_Os.
          super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::stringstream::str();
    Timing::Start(in_stack_fffffffffffff690,in_stack_fffffffffffff688);
    std::__cxx11::string::~string(local_610);
    InitializeHeuristicsForJA
              (in_stack_fffffffffffff750,(Index)((ulong)in_stack_fffffffffffff748 >> 0x20));
    in_stack_fffffffffffff698 =
         &in_RSI[1].super_AlphaVectorPlanning._m_Os.
          super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::stringstream::str();
    Timing::Stop(in_stack_fffffffffffff680,(string *)in_stack_fffffffffffff678);
    std::__cxx11::string::~string(local_630);
    std::__cxx11::stringstream::~stringstream(local_5f0);
    in_stack_fffffffffffff690 =
         (Timing *)std::operator<<((ostream *)&std::cout,"Heuristic initialized");
    std::ostream::operator<<(in_stack_fffffffffffff690,std::endl<char,std::char_traits<char>>);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x94e6da);
    AlphaVector::AlphaVector
              ((AlphaVector *)in_stack_fffffffffffff690,(size_t)in_stack_fffffffffffff688,
               (double)in_stack_fffffffffffff680);
    AlphaVector::SetAction(&local_670,local_450);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff680,
               in_stack_fffffffffffff678);
    UnionNode(in_stack_fffffffffffff760,in_stack_fffffffffffff75c,in_stack_fffffffffffff758,
              (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)in_stack_fffffffffffff750,in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::operator[](in_RDI,(ulong)local_450);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator=
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)this_01,
               (vector<AlphaVector,_std::allocator<AlphaVector>_> *)__x);
    SoftPrintStats_abi_cxx11_(in_stack_fffffffffffff928);
    std::operator<<((ostream *)&std::cout,local_690);
    std::__cxx11::string::~string(local_690);
    AlphaVector::~AlphaVector((AlphaVector *)0x94e7c2);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff680);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff680);
  }
  for (local_698 = 0; local_698 != local_a0; local_698 = local_698 + 1) {
    for (local_6a0 = 0; local_6a0 != local_a4; local_6a0 = local_6a0 + 1) {
      boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::
      operator[]((multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                 in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
      boost::detail::multi_array::
      sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::operator[]
                ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                 in_stack_fffffffffffff6a0,(index)in_stack_fffffffffffff698);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::clear
                ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x94e981);
      boost::detail::multi_array::
      sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::~sub_array
                ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)0x94e98e)
      ;
      for (local_6c8 = 0; local_6c8 != local_a0; local_6c8 = local_6c8 + 1) {
        boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>::
        operator[]((multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::operator[]
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        in_stack_fffffffffffff680 =
             (Timing *)
             boost::detail::multi_array::
             sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::operator[]
                       ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                        in_stack_fffffffffffff6a0,(index)in_stack_fffffffffffff698);
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::clear
                  ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x94ea1d);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_1UL> *)
                   0x94ea2a);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL> *)
                   0x94ea37);
        boost::multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>::
        operator[]((multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL> *
                   )in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL>::operator[]
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL> *)
                   in_stack_fffffffffffff6b8,(index)in_stack_fffffffffffff6b0);
        ppvVar10 = boost::detail::multi_array::
                   sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL>::
                   operator[]((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL>
                               *)in_stack_fffffffffffff6a0,(index)in_stack_fffffffffffff698);
        *ppvVar10 = (vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x0;
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_1UL> *)
                   0x94eab1);
        boost::detail::multi_array::
        sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL>::~sub_array
                  ((sub_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_2UL> *)
                   0x94eabe);
      }
    }
  }
  SoftPrintStats_abi_cxx11_(in_stack_fffffffffffff928);
  this_03 = (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
             *)std::operator<<((ostream *)&std::cout,local_768);
  std::ostream::operator<<(this_03,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_768);
  Timing::PrintSummary(this_04);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  local_40a._m_timesMap._M_t._M_impl._1_1_ = 1;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)in_stack_fffffffffffff680);
  if ((local_40a._m_timesMap._M_t._M_impl._1_1_ & 1) == 0) {
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)in_stack_fffffffffffff680);
  }
  AlphaVector::~AlphaVector((AlphaVector *)0x94ecba);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(this_03);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff680);
  return in_RDI;
}

Assistant:

QFunctionsDiscrete
QBGPlanner_TreeIncPruneBnB::BackupStage(const QFunctionsDiscrete &Qs, size_t maxNrAlphas)
{
    _m_nr_bottom_hits = 0;
    _m_nr_backtracks = 0;
    _m_nodes_visited = 0;
    _m_union_nodes_at_level = vector<LIndex>(_m_maxDepth, 0);
    _m_cs_nodes_at_level = vector<LIndex>(_m_maxDepth, 0);

    ValueFunctionPOMDPDiscrete V=QFunctionsToValueFunction(Qs);



//    vector<Index> jointActionOrder=GetJointActionOrder();

    Index nrS=GetPU()->GetNrStates(),
        nrA=GetPU()->GetNrJointActions(),
        nrO=GetPU()->GetNrJointObservations();
    cout << "TreeIncPruneBGPlanner::BackupStage computing all Gaoa vectors"; cout.flush();

    //because we will need both the POMDP vector sets as well as the QBG vector sets, 
    //we can better inline and addapt ComputeAllGaoa here
//    GaobetaVectorSet temp_Gaoa =  ComputeAllGaoa(V);
//    for(GaoVectorSetIndex a=0;a!=nrA;a++) //for each joint action
//        for(GaoVectorSetIndex o=0;o!=nrO;o++) //for each joint observation
//            for(GaoVectorSetIndex aPrime=0;aPrime!=nrA;aPrime++) //for each next joint action
//            {
//                (*_m_Gaoa_storage)[a][o][aPrime] =  VectorSetToValueFunction( *temp_Gaoa[a][o][aPrime] );
//                (*_m_Gaoa)[a][o][aPrime] =  &(*_m_Gaoa_storage)[a][o][aPrime];
//            }

    //pre-compute the back-projected POMDP vector sets
    GaoVectorSet Gao=BackProject(V);
    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
        {
            VectorSet * gao = Gao[a][o];
            (*_m_Gao_storage)[a][o] = VectorSetToValueFunction( *gao );
            delete gao;
        }
    //Note we cannot prune these Gao sets, since then we do not know to which 
    //vector V[i] Gao[a][o][i] corresponds. (and we need the in order to figure
    //out what next-stage action it specifies!)
    //TODO: but we can prune them later?

    //the following allocates space for the different sets G_{a,o,\beta} (i.e., (3.15) of the QBG-techrep)
    //GaobetaVectorSet G(boost::extents[nrA][nrO][nrA]);
    //-> No: We directly add to _m_Gaoa_storage

    size_t total_number_Gaoa = 0;
    for(GaoVectorSetIndex a=0;a!=nrA;a++) //for each joint action
        for(GaoVectorSetIndex o=0;o!=nrO;o++) //for each joint observation
        {
            //instead of 
            //  for aPrime = 1:nrA
            //      for vI = 1:nrVectors
            //          if vI.GetAction = aPrime
            //we just do
            //  for vI = 1:nrVectors
            //      G[a][o][vI.GetAction].push_back( vI)

            //a pointer used to point to different vectors in Gao
            double gamma=GetPU()->GetDiscount();
            for(Index vectorI=0; vectorI!=V.size(); vectorI++) // <- for each vector in Gao[a][o]
            // ( because Gao[a][o][i] is the backprojection of V[i], this is the same as for each 
            //   vector v[vectorI] in V^t+1 )
            {
                vector<double> v_temp(GetPU()->GetNrStates());
                //add the immediate reward (which is divided equally over the vectors)
                for(Index s=0; s!=GetPU()->GetNrStates(); s++)
                {
                    double R_s_a_o = (GetPU()->GetReward(s,a)) / GetPU()->GetNrJointObservations();
                    double g_a_o_v_s =  (*_m_Gao_storage)[a][o].at(vectorI).GetValue(s);
                    v_temp.at(s) =  R_s_a_o + gamma * g_a_o_v_s;
                }
                AlphaVector v1( GetPU()->GetNrStates() );
                v1.SetValues(v_temp);
                v1.SetAction(a);
                Index aPrime = V[vectorI].GetAction(); //<- Gao does not store the next-stage actions
                (*_m_Gaoa_storage)[a][o][aPrime].push_back(v1);
            }
            //prune:
            for(Index aPrime=0; aPrime < nrA; aPrime++)
            {
#if DEBUG_QBGPlanner_TreeIncPruneBnB
                cout << "_m_Gaoa_storage[a="<<a<<"][o="<<o<<"][a'="<<aPrime<<"]  =  ";
                cout <<  SoftPrintVector( (*_m_Gaoa_storage)[a][o][aPrime] ) << endl;
#endif
                (*_m_Gaoa_storage)[a][o][aPrime] = Prune( (*_m_Gaoa_storage)[a][o][aPrime] );
                (*_m_Gaoa)[a][o][aPrime] = &((*_m_Gaoa_storage)[a][o][aPrime]);

                size_t nr = (*_m_Gaoa_storage)[a][o][aPrime].size();
#if DEBUG_QBGPlanner_TreeIncPruneBnBVerbose
                cout << "_m_Gaoa_storage[a="<<a<<"][o="<<o<<"][a'="<<aPrime<<"]  has "<<
                    nr << " vectors\n";
#endif
                total_number_Gaoa += nr;
            }
        }

    cout << " - total number of back-projected gamma vectors:" << total_number_Gaoa;
    cout << "." << endl;

    AlphaVector alpha(nrS);
   
    //TODO: could save some time by passing this in as argument (by reference) 
    QFunctionsDiscrete Q(nrA);

    // Initialize a joint policy with all individual observations
    // mapping to UNSPECIFIED_ACTION
    vector<vector<Index> > jpol;
    for(Index k=0;k!=GetPU()->GetNrAgents();++k)
    {
        vector<Index> pol(GetPU()->GetNrObservations(k),UNSPECIFIED_ACTION);
        jpol.push_back(pol);
    }

    
    //
    // About the depths: we sync the 'depth index' with the index of the 
    // joint action vector that is being specified. E.g. the 
    // union node and subsequent cross-sum node that specify the joint 
    // action for the i-th entry of the joint action vector (JAV) representation
    // (of the CBG policy beta)  are at depth i.
    //
    // So we have a tree as follows:
    // node type    depth   comments
    // union        -1      the union over joint actions a at stage t. Not explicitly represented in code.
    // cross-sum    -1      the cross-sum that adds the R^a. Not explicitly represented in code 
    //                      (because R^a vectors are divided over the Gamma_a,o,a )
    // union        0       the union over joint actions a0' to be taken for the first joint observation o0.
    // cross-sum    0       the cross-sum of G_a,o1,a1 with the union at level 1.
    // ...
    // union        k-2     ('k' is _m_maxDepth in the code and corresponds to the number of joint observations)
    // cross-sum    k-2
    // union        k-1     the (degenerate) union over the only possible joint action a{k-1}'. 
    //                      In the bottom-up (memoizer) approach it just returns G_a,o{k-1},a{k-1}'.
    // cross-sum    k-1     Only exist in the top-down approach (BnB). Then it performs the last cross-sum
    //                      (with  G_a,o{k-1},a{k-1}') to create new set of (fully specified) lower-bound vectors that
    //                      are added to L.
    //
    // !!!Attention: there is a unfortunate notation clash here. 'G' is used to denote both back-projected vectors
    // (Gaoa, Ga etc.) as well as the set of vectors that induce the 'g-function' ! (it should usually be clear from
    // context)
    //

#if REUSELOWERBOUNDS
    //if we want to use lowerbounds of previous joint actions...
    //the set of non-dominated (lower bound) vectors found so far.
    std::vector<AlphaVector> L;
#endif
    // We loop over all joint actions in the current time step
    // In BnB, this can be interpreted as a union node! (at depth - 1)
    for(Index a=0; a != nrA; a++)
    {
//#if DEBUG_QBGPlanner_TreeIncPruneBnBVerbose
        cout << "\n\n--------------------------------------\n";
        cout << "-proceeding with a="<<a<<"-------------------\n";
        cout << "--------------------------------------\n\n";
//#endif
        //the set of non-dominated (lower bound) vectors found so far.
        //(i.e., we do not prune using lowerbounds of previous joint actions)
#if ! REUSELOWERBOUNDS
        std::vector<AlphaVector> L;
#endif

        //Initialize the heuristics for this a:
        {
            stringstream ss;
            ss << "ComputePOMDPheur_ts" << GetTimeStep();
            _m_timing.Start(ss.str());
            InitializeHeuristicsForJA(a);
            _m_timing.Stop(ss.str());
        }
        cout << "Heuristic initialized" << endl;
        //The vectorset representing the implied g-function.
        //It is initialized to contain the null vector.
        std::vector<AlphaVector> G;
        AlphaVector null_vec(nrS, 0.0 );
        null_vec.SetAction(a);
        G.push_back(null_vec);

        // we don't start with CrossSum as the reward is already in Gaoa
        UnionNode(a,0,jpol, L, G);

        //TODO: check if this is not necessary:
        //L = Prune(L);

        //Frans 20111005: euhm...? this confuses me plenty. The set of vectors in L (Ga in memoization version)
        //correspond to all kind of different betaI. Really we would need to track the indices along with the
        //vectors...?!

        //AlphaVector::BGPolicyIndex betaI=-1; // NEED TO FIGURE OUT BETAI DOWN THE TREE SOMEHOW - TODO
        //Q[a]=VectorSetToValueFunction(L,a,betaI); //<- No, L now contains vectors for all actions.
#if !REUSELOWERBOUNDS
        Q[a] = L;
#endif
        //Q[a] = Prune(L);
        cout << SoftPrintStats();
    }
#if REUSELOWERBOUNDS
    //  On second though, I'm not sure if we can prune using lower bounds of other actions.
    //  (gives e.g., BackupStage finished, returning Q=
    //      < < a 0 bI -1 : values -4 -4 >, <  >, <  >, <  >, <  >, <  >, <  >, <  >, <  > >
    //  )

    //sort the vectors per action:
    for(Index lvecI=0; lvecI < L.size(); lvecI++)
    {
        AlphaVector lvec = L[lvecI];
        Index a =  lvec.GetAction();
        if (a > nrA)
        {
            stringstream ss; ss << "ERROR: action index=%d!?!" << a << endl;
            throw E(ss);
        }
        Q[ a ].push_back(lvec);
    }
#endif    

    //clean up:
    for(GaoVectorSetIndex a=0;a!=nrA;a++) //for each joint action
        for(GaoVectorSetIndex o=0;o!=nrO;o++) //for each joint observation
        {
            (*_m_Gao_storage)[a][o].clear();
            for(GaoVectorSetIndex aPrime=0;aPrime!=nrA;aPrime++) //for each next joint a
            {
                (*_m_Gaoa_storage)[a][o][aPrime].clear();
                (*_m_Gaoa)[a][o][aPrime] = 0; //not necessary I think, but shouldn't hurt
            }
        }

#if DEBUG_QBGPlanner_TreeIncPruneBnB
    cout << "BackupStage finished, returning Q=\n";
    for(Index a=0; a != nrA; a++)
        cout << "a=" << a << " - " << PrintTools::SoftPrintVector(Q[a]) << endl;
#endif
    cout << SoftPrintStats() << endl;
    
    _m_timing.PrintSummary();
    cout << endl;

    return(Q);
}